

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O1

KBOOL __thiscall KDIS::DATA_TYPE::AggregateType::operator<(AggregateType *this,AggregateType *Value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar1._0_1_ = this->m_ui8Kind;
  uVar1._1_1_ = this->m_ui8Domain;
  uVar1._2_2_ = this->m_ui16Country;
  iVar2._0_1_ = this->m_ui8Category;
  iVar2._1_1_ = this->m_ui8SubCategory;
  iVar2._2_1_ = this->m_ui8Specific;
  iVar2._3_1_ = this->m_ui8Extra;
  uVar3._0_1_ = Value->m_ui8Kind;
  uVar3._1_1_ = Value->m_ui8Domain;
  uVar3._2_2_ = Value->m_ui16Country;
  iVar4._0_1_ = Value->m_ui8Category;
  iVar4._1_1_ = Value->m_ui8SubCategory;
  iVar4._2_1_ = Value->m_ui8Specific;
  iVar4._3_1_ = Value->m_ui8Extra;
  return ((ulong)this->m_ui8Extra |
         (ulong)this->m_ui8Specific << 8 |
         (ulong)this->m_ui8SubCategory << 0x10 |
         (ulong)(uint)(iVar2 << 0x18) |
         (ulong)this->m_ui16Country << 0x20 |
         (ulong)this->m_ui8Domain << 0x30 | (ulong)uVar1 << 0x38) <
         ((ulong)Value->m_ui8Extra |
         (ulong)Value->m_ui8Specific << 8 |
         (ulong)Value->m_ui8SubCategory << 0x10 |
         (ulong)(uint)(iVar4 << 0x18) |
         (ulong)Value->m_ui16Country << 0x20 |
         (ulong)Value->m_ui8Domain << 0x30 | (ulong)uVar3 << 0x38);
}

Assistant:

KBOOL AggregateType::operator < ( const AggregateType & Value ) const
{
    // We will bit shift all 7 fields into a single KUINT64, this will generate a new unique value which we can then use for comparison.
    // bits 56-63 = Kind
    // bits 48-55 = Domain
    // bits 32-47 = Country
    // bits 24-31 = Category
    // bits 16-23 = SubCategory
    // bits 8-15  = Specific
    // bits 0-7   = Extra
    KUINT64 ui64ThisCmpVal = 0, ui64OtherCmpVal = 0;

    ui64ThisCmpVal = ( KUINT64 )m_ui8Kind << 56 | ( KUINT64 )m_ui8Domain << 48 | ( KUINT64 )m_ui16Country << 32 | ( KUINT64 )m_ui8Category << 24 | ( KUINT64 )m_ui8SubCategory << 16 | ( KUINT64 )m_ui8Specific << 8 | ( KUINT64 )m_ui8Extra;

    ui64OtherCmpVal = ( KUINT64 )Value.m_ui8Kind << 56 | ( KUINT64 )Value.m_ui8Domain << 48 | ( KUINT64 )Value.m_ui16Country << 32 | ( KUINT64 )Value.m_ui8Category << 24 | ( KUINT64 )Value.m_ui8SubCategory << 16 | ( KUINT64 )Value.m_ui8Specific << 8 | ( KUINT64 )Value.m_ui8Extra;

    return ui64ThisCmpVal < ui64OtherCmpVal;
}